

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

TextClassifier * __thiscall CoreML::Specification::Model::mutable_textclassifier(Model *this)

{
  bool bVar1;
  TextClassifier *this_00;
  Model *this_local;
  
  bVar1 = has_textclassifier(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_textclassifier(this);
    this_00 = (TextClassifier *)operator_new(0x38);
    CoreMLModels::TextClassifier::TextClassifier(this_00);
    (this->Type_).textclassifier_ = this_00;
  }
  return (TextClassifier *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::TextClassifier* Model::mutable_textclassifier() {
  if (!has_textclassifier()) {
    clear_Type();
    set_has_textclassifier();
    Type_.textclassifier_ = new ::CoreML::Specification::CoreMLModels::TextClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.textClassifier)
  return Type_.textclassifier_;
}